

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_factory.cpp
# Opt level: O0

size_t anon_unknown.dwarf_1d4df2::streamsize(istream *stream)

{
  streamoff sVar1;
  ulong uVar2;
  unsigned_long uVar3;
  size_t sVar4;
  fpos local_20 [8];
  pos_type size;
  istream *stream_local;
  
  std::istream::seekg((long)stream,_S_beg);
  _local_20 = std::istream::tellg();
  std::istream::seekg((long)stream,_S_beg);
  sVar1 = std::fpos::operator_cast_to_long(local_20);
  if (sVar1 < 0) {
    __assert_fail("size >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/src/rom_factory.cpp"
                  ,0x1b,"size_t (anonymous namespace)::streamsize(std::istream &)");
  }
  uVar2 = std::fpos::operator_cast_to_long(local_20);
  uVar3 = std::numeric_limits<unsigned_long>::max();
  if (uVar2 <= uVar3) {
    sVar4 = std::fpos::operator_cast_to_long(local_20);
    return sVar4;
  }
  __assert_fail("static_cast<uint64_t>(size) <= std::numeric_limits<size_t>::max()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/src/rom_factory.cpp"
                ,0x1c,"size_t (anonymous namespace)::streamsize(std::istream &)");
}

Assistant:

size_t streamsize(std::istream &stream) {
    stream.seekg(0, std::ios::end);
    std::istream::pos_type size = stream.tellg();
    stream.seekg(0, std::ios::beg);

    assert(size >= 0);
    assert(static_cast<uint64_t>(size) <= std::numeric_limits<size_t>::max());
    return static_cast<size_t>(size);
}